

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::TNHOracle::TNHOracle(TNHOracle *this,Module *wasm,PassOptions *options)

{
  anon_class_16_2_83b1a94b local_50;
  function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)> local_40;
  PassOptions *local_20;
  PassOptions *options_local;
  Module *wasm_local;
  TNHOracle *this_local;
  
  local_50.this = this;
  local_50.options = options;
  local_20 = options;
  options_local = (PassOptions *)wasm;
  wasm_local = (Module *)this;
  std::function<void(wasm::Function*,wasm::(anonymous_namespace)::TNHInfo&)>::
  function<wasm::(anonymous_namespace)::TNHOracle::TNHOracle(wasm::Module&,wasm::PassOptions_const&)::_lambda(wasm::Function*,wasm::(anonymous_namespace)::TNHInfo&)_1_,void>
            ((function<void(wasm::Function*,wasm::(anonymous_namespace)::TNHInfo&)> *)&local_40,
             &local_50);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            (&this->
              super_ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             ,wasm,(Func *)&local_40);
  std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::TNHInfo_&)>::~function
            (&local_40);
  this->options = local_20;
  std::
  unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
  ::unordered_map(&this->inferences);
  infer(this);
  return;
}

Assistant:

TNHOracle(Module& wasm, const PassOptions& options)
    : Parent(wasm,
             [this, &options](Function* func, TNHInfo& info) {
               scan(func, info, options);
             }),
      options(options) {

    // After the scanning phase that we run in the constructor, continue to the
    // second phase of analysis: inference.
    infer();
  }